

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_9d1d6::GraphEdgeClipper::GraphEdgeClipper
          (GraphEdgeClipper *this,Graph *g,
          vector<signed_char,_std::allocator<signed_char>_> *input_dimensions,
          InputEdgeCrossings *input_crossings,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *new_edges,
          vector<int,_std::allocator<int>_> *new_input_edge_ids)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  size_type sVar2;
  reference pvVar3;
  int local_4c;
  allocator<int> local_45;
  int i;
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *new_input_edge_ids_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *new_edges_local;
  InputEdgeCrossings *input_crossings_local;
  vector<signed_char,_std::allocator<signed_char>_> *input_dimensions_local;
  Graph *g_local;
  GraphEdgeClipper *this_local;
  
  this->g_ = g;
  local_38 = new_input_edge_ids;
  new_input_edge_ids_local = (vector<int,_std::allocator<int>_> *)new_edges;
  new_edges_local =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)input_crossings;
  input_crossings_local = (InputEdgeCrossings *)input_dimensions;
  input_dimensions_local = (vector<signed_char,_std::allocator<signed_char>_> *)g;
  g_local = (Graph *)this;
  S2Builder::Graph::VertexInMap::VertexInMap(&this->in_,g);
  S2Builder::Graph::VertexOutMap::VertexOutMap(&this->out_,(Graph *)input_dimensions_local);
  this->input_dimensions_ =
       (vector<signed_char,_std::allocator<signed_char>_> *)input_crossings_local;
  this->input_crossings_ = (InputEdgeCrossings *)new_edges_local;
  this->new_edges_ =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
       new_input_edge_ids_local;
  this->new_input_edge_ids_ = local_38;
  pvVar1 = S2Builder::Graph::input_edge_id_set_ids((Graph *)input_dimensions_local);
  this->input_ids_ = pvVar1;
  GetInputEdgeChainOrder(&this->order_,this->g_,this->input_ids_);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->order_);
  std::allocator<int>::allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector(&this->rank_,sVar2,&local_45);
  std::allocator<int>::~allocator(&local_45);
  local_4c = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->order_);
    if (sVar2 <= (ulong)(long)local_4c) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->order_,(long)local_4c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->rank_,(long)*pvVar3);
    *pvVar3 = local_4c;
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

GraphEdgeClipper::GraphEdgeClipper(
    const Graph& g, const vector<int8>& input_dimensions,
    const InputEdgeCrossings& input_crossings,
    vector<Graph::Edge>* new_edges,
    vector<InputEdgeIdSetId>* new_input_edge_ids)
    : g_(g), in_(g), out_(g),
      input_dimensions_(input_dimensions),
      input_crossings_(input_crossings),
      new_edges_(new_edges),
      new_input_edge_ids_(new_input_edge_ids),
      input_ids_(g.input_edge_id_set_ids()),
      order_(GetInputEdgeChainOrder(g_, input_ids_)),
      rank_(order_.size()) {
  for (int i = 0; i < order_.size(); ++i) {
    rank_[order_[i]] = i;
  }
}